

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result wabt::interp::Match(MemoryType *expected,MemoryType *actual,string *out_msg)

{
  Result RVar1;
  string local_30;
  
  if (expected->page_size == actual->page_size) {
    RVar1 = Match(&expected->limits,&actual->limits,out_msg);
    return (Result)RVar1.enum_;
  }
  StringPrintf_abi_cxx11_
            (&local_30,"page_size mismatch in imported memory, expected %u but got %u.");
  std::__cxx11::string::operator=((string *)out_msg,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (Result)Error;
}

Assistant:

Result Match(const MemoryType& expected,
             const MemoryType& actual,
             std::string* out_msg) {
  if (expected.page_size != actual.page_size) {
    *out_msg = StringPrintf(
        "page_size mismatch in imported memory, expected %u but got %u.",
        expected.page_size, actual.page_size);
    return Result::Error;
  }
  return Match(expected.limits, actual.limits, out_msg);
}